

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O2

QDBusArgument * operator>>(QDBusArgument *arg,QList<QDBusMenuLayoutItem> *list)

{
  char cVar1;
  long in_FS_OFFSET;
  undefined1 *local_58;
  QVariantMap local_50;
  Data *pDStack_48;
  QDBusMenuLayoutItem *local_40;
  qsizetype qStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginArray();
  QList<QDBusMenuLayoutItem>::clear(list);
  while( true ) {
    cVar1 = QDBusArgument::atEnd();
    if (cVar1 != '\0') break;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = (QDBusMenuLayoutItem *)0x0;
    qStack_38 = 0;
    local_50.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
          )(totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
            )0x0;
    pDStack_48 = (Data *)0x0;
    operator>>(arg,(QDBusMenuLayoutItem *)&local_58);
    QList<QDBusMenuLayoutItem>::emplaceBack<QDBusMenuLayoutItem_const&>
              (list,(QDBusMenuLayoutItem *)&local_58);
    QDBusMenuLayoutItem::~QDBusMenuLayoutItem((QDBusMenuLayoutItem *)&local_58);
  }
  QDBusArgument::endArray();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return arg;
  }
  __stack_chk_fail();
}

Assistant:

inline const QDBusArgument &operator>>(const QDBusArgument &arg, Container<T> &list)
{
    arg.beginArray();
    list.clear();
    while (!arg.atEnd()) {
        T item;
        arg >> item;
        list.push_back(item);
    }

    arg.endArray();
    return arg;
}